

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O0

int gdImageSubSharpen(int pc,int c,int nc,float inner_coeff,float outer_coeff)

{
  undefined4 local_28;
  float alpha;
  float blue;
  float green;
  float red;
  float outer_coeff_local;
  float inner_coeff_local;
  int nc_local;
  int c_local;
  int pc_local;
  
  blue = inner_coeff * (float)((int)(c & 0xff0000U) >> 0x10) +
         outer_coeff * (float)(((int)(pc & 0xff0000U) >> 0x10) + ((int)(nc & 0xff0000U) >> 0x10));
  alpha = inner_coeff * (float)((int)(c & 0xff00U) >> 8) +
          outer_coeff * (float)(((int)(pc & 0xff00U) >> 8) + ((int)(nc & 0xff00U) >> 8));
  local_28 = inner_coeff * (float)(c & 0xff) + outer_coeff * (float)((pc & 0xffU) + (nc & 0xffU));
  if (255.0 < blue) {
    blue = 255.0;
  }
  if (255.0 < alpha) {
    alpha = 255.0;
  }
  if (255.0 < local_28) {
    local_28 = 255.0;
  }
  if (blue < 0.0) {
    blue = 0.0;
  }
  if (alpha < 0.0) {
    alpha = 0.0;
  }
  if (local_28 < 0.0) {
    local_28 = 0.0;
  }
  return (int)(float)((int)(c & 0x7f000000U) >> 0x18) * 0x1000000 + (int)blue * 0x10000 +
         (int)alpha * 0x100 + (int)local_28;
}

Assistant:

int
gdImageSubSharpen (int pc, int c, int nc, float inner_coeff, float
                   outer_coeff)
{
	float red, green, blue, alpha;

	red = inner_coeff * gdTrueColorGetRed (c) + outer_coeff *
	      (gdTrueColorGetRed (pc) + gdTrueColorGetRed (nc));
	green = inner_coeff * gdTrueColorGetGreen (c) + outer_coeff *
	        (gdTrueColorGetGreen (pc) + gdTrueColorGetGreen (nc));
	blue = inner_coeff * gdTrueColorGetBlue (c) + outer_coeff *
	       (gdTrueColorGetBlue (pc) + gdTrueColorGetBlue (nc));
	alpha = gdTrueColorGetAlpha (c);

	/* Clamping, as can overshoot bounds in either direction */
	if (red > 255.0f) {
		red = 255.0f;
	}
	if (green > 255.0f) {
		green = 255.0f;
	}
	if (blue > 255.0f) {
		blue = 255.0f;
	}
	if (red < 0.0f) {
		red = 0.0f;
	}
	if (green < 0.0f) {
		green = 0.0f;
	}
	if (blue < 0.0f) {
		blue = 0.0f;
	}

	return gdTrueColorAlpha ((int) red, (int) green, (int) blue, (int) alpha);
}